

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

ssize_t __thiscall CTcDataStream::write(CTcDataStream *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  size_t cur;
  CTcDataStream *in_stack_ffffffffffffffe0;
  CTcDataStream *local_18;
  void *local_10;
  
  local_10 = (void *)CONCAT44(in_register_00000034,__fd);
  local_18 = (CTcDataStream *)__buf;
  if ((void *)this->rem_ < __buf) {
    do {
      if (this->rem_ == 0) {
        alloc_page(in_stack_ffffffffffffffe0);
      }
      in_stack_ffffffffffffffe0 = local_18;
      if ((CTcDataStream *)this->rem_ < local_18) {
        in_stack_ffffffffffffffe0 = (CTcDataStream *)this->rem_;
      }
      memcpy(this->wp_,local_10,(size_t)in_stack_ffffffffffffffe0);
      this->ofs_ = (long)&in_stack_ffffffffffffffe0->_vptr_CTcDataStream + this->ofs_;
      this->wp_ = this->wp_ + (long)&in_stack_ffffffffffffffe0->_vptr_CTcDataStream;
      this->rem_ = this->rem_ - (long)in_stack_ffffffffffffffe0;
      local_10 = (void *)((long)&in_stack_ffffffffffffffe0->_vptr_CTcDataStream + (long)local_10);
      local_18 = (CTcDataStream *)((long)local_18 - (long)in_stack_ffffffffffffffe0);
    } while (local_18 != (CTcDataStream *)0x0);
    this = (CTcDataStream *)0x0;
  }
  else {
    memcpy(this->wp_,local_10,(size_t)__buf);
    this->ofs_ = (long)__buf + this->ofs_;
    this->wp_ = (char *)((long)__buf + (long)this->wp_);
    this->rem_ = this->rem_ - (long)__buf;
  }
  return (ssize_t)this;
}

Assistant:

void CTcDataStream::write(const char *buf, size_t len)
{
    /* 
     *   if possible, write it in one go (this is for efficiency, so that
     *   we can avoid making a few comparisons in the most common case) 
     */
    if (len <= rem_)
    {
        /* write the data */
        memcpy(wp_, buf, len);

        /* advance the output pointers */
        ofs_ += len;
        wp_ += len;
        rem_ -= len;
    }
    else
    {
        /* keep going until we satisfy the request */
        do
        {
            size_t cur;

            /* if necessary, allocate more memory */
            if (rem_ == 0)
                alloc_page();

            /* limit this chunk to the space remaining on the current page */
            cur = len;
            if (cur > rem_)
                cur = rem_;

            /* copy it to the page */
            memcpy(wp_, buf, cur);

            /* skip past the space written in the destination */
            ofs_ += cur;
            wp_ += cur;
            rem_ -= cur;

            /* advance past the space in the source */
            buf += cur;
            len -= cur;

        } while (len != 0);
    }
}